

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void primaryexp(LexState *ls,expdesc *v)

{
  Token *pTVar1;
  Token *pTVar2;
  uint uVar3;
  FuncState *fs;
  SemInfo SVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  TValue *i_o;
  expdesc key;
  Value local_58;
  uint local_50;
  undefined8 local_48;
  SemInfo *local_40;
  Token *local_38;
  
  fs = ls->fs;
  pTVar1 = &ls->t;
  iVar7 = (ls->t).token;
  if (iVar7 == 0x11d) {
    singlevar(ls,v);
  }
  else {
    if (iVar7 != 0x28) {
      luaX_lexerror(ls,"unexpected symbol",iVar7);
    }
    iVar7 = ls->linenumber;
    iVar6 = (ls->lookahead).token;
    ls->lastline = iVar7;
    if (iVar6 == 0x11f) {
      iVar6 = llex(ls,&(ls->t).seminfo);
      (ls->t).token = iVar6;
    }
    else {
      pTVar2 = &ls->lookahead;
      uVar5 = *(undefined4 *)&pTVar2->field_0x4;
      SVar4 = (ls->lookahead).seminfo;
      pTVar1->token = pTVar2->token;
      *(undefined4 *)&pTVar1->field_0x4 = uVar5;
      (ls->t).seminfo = SVar4;
      pTVar2->token = 0x11f;
    }
    subexpr(ls,v,0);
    check_match(ls,0x29,0x28,iVar7);
    luaK_dischargevars(ls->fs,v);
  }
  local_38 = &ls->lookahead;
  local_40 = &(ls->t).seminfo;
LAB_0010f0d6:
  while (iVar7 = pTVar1->token, 0x5a < iVar7) {
    if (iVar7 != 0x5b) {
      if ((iVar7 != 0x7b) && (iVar7 != 0x11e)) {
        return;
      }
      goto LAB_0010f12e;
    }
    luaK_exp2anyreg(fs,v);
    yindex(ls,(expdesc *)&local_58);
    iVar7 = luaK_exp2RK(fs,(expdesc *)&local_58);
    (v->u).s.aux = iVar7;
    v->k = VINDEXED;
  }
  if (iVar7 == 0x28) {
LAB_0010f12e:
    luaK_exp2nextreg(fs,v);
  }
  else {
    if (iVar7 == 0x2e) {
      field(ls,v);
      goto LAB_0010f0d6;
    }
    if (iVar7 != 0x3a) {
      return;
    }
    iVar7 = (ls->lookahead).token;
    ls->lastline = ls->linenumber;
    if (iVar7 == 0x11f) {
      iVar7 = llex(ls,local_40);
      (ls->t).token = iVar7;
    }
    else {
      uVar5 = *(undefined4 *)&local_38->field_0x4;
      SVar4 = local_38->seminfo;
      pTVar1->token = local_38->token;
      *(undefined4 *)&pTVar1->field_0x4 = uVar5;
      (ls->t).seminfo = SVar4;
      local_38->token = 0x11f;
    }
    local_58.gc = (GCObject *)str_checkname(ls);
    local_50 = 4;
    local_50 = addk(ls->fs,(TValue *)&local_58,(TValue *)&local_58);
    local_48 = 0xffffffffffffffff;
    local_58.b = 4;
    luaK_exp2anyreg(fs,v);
    if (((v->k == VNONRELOC) && (uVar3 = (v->u).s.info, (uVar3 >> 8 & 1) == 0)) &&
       ((int)(uint)fs->nactvar <= (int)uVar3)) {
      fs->freereg = fs->freereg + -1;
    }
    iVar7 = fs->freereg;
    luaK_checkstack(fs,2);
    fs->freereg = fs->freereg + 2;
    iVar6 = (v->u).s.info;
    iVar8 = luaK_exp2RK(fs,(expdesc *)&local_58);
    luaK_code(fs,iVar6 << 0x17 | iVar7 << 6 | iVar8 << 0xe | 0xb,fs->ls->lastline);
    if (((local_58.b == 0xc) && ((local_50 >> 8 & 1) == 0)) &&
       ((int)(uint)fs->nactvar <= (int)local_50)) {
      fs->freereg = fs->freereg + -1;
    }
    (v->u).s.info = iVar7;
    v->k = VNONRELOC;
  }
  funcargs(ls,v);
  goto LAB_0010f0d6;
}

Assistant:

static void primaryexp(LexState*ls,expdesc*v){
FuncState*fs=ls->fs;
prefixexp(ls,v);
for(;;){
switch(ls->t.token){
case'.':{
field(ls,v);
break;
}
case'[':{
expdesc key;
luaK_exp2anyreg(fs,v);
yindex(ls,&key);
luaK_indexed(fs,v,&key);
break;
}
case':':{
expdesc key;
luaX_next(ls);
checkname(ls,&key);
luaK_self(fs,v,&key);
funcargs(ls,v);
break;
}
case'(':case TK_STRING:case'{':{
luaK_exp2nextreg(fs,v);
funcargs(ls,v);
break;
}
default:return;
}
}
}